

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chameleon-core.cpp
# Opt level: O3

double * read2d(char *charfilename,char *charplane)

{
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  mapped_type *pmVar6;
  long lVar7;
  ostream *poVar8;
  void *pvVar9;
  istream *piVar10;
  double *pdVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  double *pdVar17;
  void *pvVar18;
  long lVar19;
  string plane;
  string filename;
  fstream fs;
  key_type local_2a0;
  char *local_280;
  long local_278;
  char local_270 [16];
  char *local_260;
  long local_258;
  char local_250 [16];
  key_type local_240;
  byte abStack_220 [496];
  
  std::__cxx11::string::string((string *)&local_260,charfilename,(allocator *)&local_240);
  std::__cxx11::string::string((string *)&local_280,charplane,(allocator *)&local_240);
  paVar2 = &local_240.field_2;
  local_240._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"nx","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::operator[](&conf_abi_cxx11_,&local_240);
  lVar14 = (long)*pmVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  local_240._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"ny","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::operator[](&conf_abi_cxx11_,&local_240);
  lVar13 = (long)*pmVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  local_240._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"nz","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::operator[](&conf_abi_cxx11_,&local_240);
  lVar7 = (long)*pmVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  std::fstream::fstream(&local_240,(string *)&local_260,_S_in);
  if ((abStack_220[*(long *)(local_240._M_dataplus._M_p + -0x18)] & 5) == 0) {
    paVar2 = &local_2a0.field_2;
    local_2a0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"output_mode","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::operator[](&conf_abi_cxx11_,&local_2a0);
    dVar3 = *pmVar6;
    lVar1 = lVar7 + lVar13;
    uVar12 = lVar7 * lVar13;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    uVar16 = lVar1 * lVar14 + uVar12;
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      local_2a0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"output_mode","");
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::operator[](&conf_abi_cxx11_,&local_2a0);
      dVar3 = *pmVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != paVar2) {
        operator_delete(local_2a0._M_dataplus._M_p);
      }
      if ((dVar3 != 1.0) || (NAN(dVar3))) {
        poVar8 = (ostream *)&std::cerr;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"libchameleon: read:: ERROR: unknown output_mode",0x2f);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
        goto LAB_0010398c;
      }
      std::fstream::close();
      std::fstream::open((string *)&local_240,(_Ios_Openmode)&local_260);
      uVar15 = 0xffffffffffffffff;
      if (uVar16 < 0x2000000000000000) {
        uVar15 = uVar16 * 8;
      }
      pvVar9 = operator_new__(uVar15);
      std::istream::read((char *)&local_240,(long)pvVar9);
    }
    else {
      uVar15 = 0xffffffffffffffff;
      if (uVar16 < 0x2000000000000000) {
        uVar15 = uVar16 * 8;
      }
      pvVar9 = operator_new__(uVar15);
      lVar19 = 0;
      do {
        piVar10 = std::istream::_M_extract<double>((double *)&local_240);
        if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) break;
        bVar4 = lVar19 < (long)uVar16;
        lVar19 = lVar19 + 1;
      } while (bVar4);
    }
    std::fstream::close();
    iVar5 = std::__cxx11::string::compare((char *)&local_280);
    if (iVar5 == 0) {
      uVar12 = 0xffffffffffffffff;
      if ((ulong)(lVar13 * lVar14) < 0x2000000000000000) {
        uVar12 = lVar13 * lVar14 * 8;
      }
      pdVar11 = (double *)operator_new__(uVar12);
      if (0 < lVar14) {
        pdVar17 = pdVar11;
        pvVar18 = pvVar9;
        do {
          if (0 < lVar13) {
            memcpy(pdVar17,pvVar18,lVar13 * 8);
          }
          pvVar18 = (void *)((long)pvVar18 + lVar1 * 8);
          pdVar17 = pdVar17 + lVar13;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)&local_280);
      if (iVar5 == 0) {
        uVar12 = 0xffffffffffffffff;
        if ((ulong)(lVar7 * lVar14) < 0x2000000000000000) {
          uVar12 = lVar7 * lVar14 * 8;
        }
        pdVar11 = (double *)operator_new__(uVar12);
        if (0 < lVar14) {
          pvVar18 = (void *)((long)pvVar9 + lVar13 * 8);
          pdVar17 = pdVar11;
          do {
            if (0 < lVar7) {
              memcpy(pdVar17,pvVar18,lVar7 * 8);
            }
            pvVar18 = (void *)((long)pvVar18 + lVar1 * 8);
            pdVar17 = pdVar17 + lVar7;
            lVar14 = lVar14 + -1;
          } while (lVar14 != 0);
        }
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&local_280);
        if (iVar5 == 0) {
          uVar16 = 0xffffffffffffffff;
          if (uVar12 < 0x2000000000000000) {
            uVar16 = uVar12 * 8;
          }
          pdVar11 = (double *)operator_new__(uVar16);
          if (0 < lVar13) {
            lVar19 = 0;
            do {
              if (0 < lVar7) {
                memcpy((void *)((long)pdVar11 + lVar19),
                       (void *)((long)pvVar9 + lVar19 + lVar1 * lVar14 * 8),lVar7 * 8);
              }
              lVar19 = lVar19 + lVar7 * 8;
              lVar13 = lVar13 + -1;
            } while (lVar13 != 0);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "libchameleon: read: possible plane values are xy, xz and yz,given: ",0x43);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_280,local_278);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          pdVar11 = (double *)0x0;
        }
      }
    }
    operator_delete__(pvVar9);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"libchameleon: read: ERROR: no such file, ",0x29);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_260,local_258);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
LAB_0010398c:
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    pdVar11 = (double *)0x0;
  }
  std::fstream::~fstream(&local_240);
  if (local_280 != local_270) {
    operator_delete(local_280);
  }
  if (local_260 != local_250) {
    operator_delete(local_260);
  }
  return pdVar11;
}

Assistant:

double* read2d(const char* charfilename, const char* charplane) {
    string filename(charfilename);
    string plane(charplane);
    long nx = conf["nx"];
    long ny = conf["ny"];
    long nz = conf["nz"];
    long n = nx * (ny + nz) + ny * nz;
    double* a;
    fstream fs(filename, ios_base::in);
    if (fs) {
        if (conf["output_mode"] == 0) {
            // text mode
            a = new double[n];
            long i = 0;
            while (fs >> a[i] && i < n)
                ++i;
        } else if (conf["output_mode"] == 1) {
            // binary mode
            fs.close();
            fs.open(filename, ios_base::in | ios_base::binary);
            a = new double[n];
            fs.read(reinterpret_cast<char*>(a), sizeof(double) * n);
        } else {
            cerr << "libchameleon: read:: ERROR: unknown output_mode" << endl;
            return nullptr;
        }
    } else {
        cerr << "libchameleon: read: ERROR: no such file, " << filename <<
            endl;
        return nullptr;
    }
    fs.close();
    double* b;
    if (plane == "xy") {
        b = new double[nx * ny];
        for (long i = 0; i < nx; ++i)
            for (long j = 0; j < ny; ++j)
                b[i * ny + j] = a[i * (ny + nz) + j];
    } else if (plane == "xz") {
        b = new double[nx * nz];
        for (long i = 0; i < nx; ++i)
            for (long j = 0; j < nz; ++j)
                b[i * nz + j] = a[i * (ny + nz) + ny + j];
    } else if (plane == "yz") {
        b = new double[ny * nz];
        for (long i = 0; i < ny; ++i)
            for (long j = 0; j < nz; ++j)
                b[i * nz + j] = a[nx * (ny + nz) + i * nz + j];
    } else {
        cerr << "libchameleon: read: possible plane values are xy, xz and yz,"
            "given: " << plane << endl;
        delete[] a;
        return nullptr;
    }
    delete[] a;
    return b;
}